

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cpio.c
# Opt level: O1

int archive_read_format_cpio_read_header(archive_read *a,archive_entry *entry)

{
  void *pvVar1;
  long *__ptr;
  long *plVar2;
  long lVar3;
  int iVar4;
  wchar_t wVar5;
  mode_t mVar6;
  int iVar7;
  uint uVar8;
  archive_string_conv *paVar9;
  char *pcVar10;
  int *piVar11;
  char *pcVar12;
  dev_t dVar13;
  undefined8 *puVar14;
  size_t namelength;
  size_t name_pad;
  size_t local_50;
  long local_48;
  long *local_40;
  la_int64_t local_38;
  
  pvVar1 = a->format->data;
  paVar9 = *(archive_string_conv **)((long)pvVar1 + 0x38);
  if (paVar9 == (archive_string_conv *)0x0) {
    if (*(int *)((long)pvVar1 + 0x48) == 0) {
      paVar9 = archive_string_default_conversion_for_read(&a->archive);
      *(archive_string_conv **)((long)pvVar1 + 0x40) = paVar9;
      *(undefined4 *)((long)pvVar1 + 0x48) = 1;
    }
    paVar9 = *(archive_string_conv **)((long)pvVar1 + 0x40);
  }
  iVar4 = (**(code **)((long)pvVar1 + 8))(a,pvVar1,entry,&local_50,&local_48);
  if (iVar4 < -0x14) {
    return iVar4;
  }
  pcVar10 = (char *)__archive_read_ahead(a,local_48 + local_50,(ssize_t *)0x0);
  if (pcVar10 == (char *)0x0) {
    return -0x1e;
  }
  wVar5 = _archive_entry_copy_pathname_l(entry,pcVar10,local_50,paVar9);
  if (wVar5 != L'\0') {
    piVar11 = __errno_location();
    if (*piVar11 == 0xc) {
      pcVar10 = "Can\'t allocate memory for Pathname";
      goto LAB_00171784;
    }
    pcVar12 = archive_string_conversion_charset_name(paVar9);
    archive_set_error(&a->archive,0x54,"Pathname can\'t be converted from %s to current locale.",
                      pcVar12);
    iVar4 = -0x14;
  }
  *(undefined8 *)((long)pvVar1 + 0x28) = 0;
  __archive_read_consume(a,local_48 + local_50);
  mVar6 = archive_entry_filetype(entry);
  if (mVar6 == 0xa000) {
    pcVar10 = (char *)__archive_read_ahead(a,*(size_t *)((long)pvVar1 + 0x18),(ssize_t *)0x0);
    if (pcVar10 == (char *)0x0) {
      return -0x1e;
    }
    wVar5 = _archive_entry_copy_symlink_l(entry,pcVar10,*(size_t *)((long)pvVar1 + 0x18),paVar9);
    if (wVar5 != L'\0') {
      piVar11 = __errno_location();
      if (*piVar11 == 0xc) {
        pcVar10 = "Can\'t allocate memory for Linkname";
        goto LAB_00171784;
      }
      pcVar12 = archive_string_conversion_charset_name(paVar9);
      archive_set_error(&a->archive,0x54,"Linkname can\'t be converted from %s to current locale.",
                        pcVar12);
      iVar4 = -0x14;
    }
    __archive_read_consume(a,*(int64_t *)((long)pvVar1 + 0x18));
    *(undefined8 *)((long)pvVar1 + 0x18) = 0;
  }
  if ((local_50 == 0xb) && (iVar7 = strcmp(pcVar10,"TRAILER!!!"), iVar7 == 0)) {
    archive_clear_error(&a->archive);
    return 1;
  }
  uVar8 = archive_entry_nlink(entry);
  if (uVar8 < 2) {
    return iVar4;
  }
  dVar13 = archive_entry_dev(entry);
  local_38 = archive_entry_ino64(entry);
  local_40 = *(long **)((long)pvVar1 + 0x10);
  for (__ptr = local_40; __ptr != (long *)0x0; __ptr = (long *)*__ptr) {
    if ((__ptr[3] == dVar13) && (__ptr[4] == local_38)) {
      archive_entry_copy_hardlink(entry,(char *)__ptr[5]);
      lVar3 = __ptr[2];
      *(int *)(__ptr + 2) = (int)lVar3 + -1;
      if ((int)lVar3 < 2) {
        plVar2 = (long *)__ptr[1];
        if (plVar2 != (long *)0x0) {
          *plVar2 = *__ptr;
        }
        lVar3 = *__ptr;
        if (lVar3 != 0) {
          *(long **)(lVar3 + 8) = plVar2;
        }
        if (*(long **)((long)pvVar1 + 0x10) == __ptr) {
          *(long *)((long)pvVar1 + 0x10) = lVar3;
        }
        free((void *)__ptr[5]);
        free(__ptr);
        return iVar4;
      }
      return iVar4;
    }
  }
  puVar14 = (undefined8 *)malloc(0x30);
  if (puVar14 != (undefined8 *)0x0) {
    if (local_40 != (long *)0x0) {
      local_40[1] = (long)puVar14;
    }
    *puVar14 = local_40;
    puVar14[1] = 0;
    *(undefined8 **)((long)pvVar1 + 0x10) = puVar14;
    puVar14[3] = dVar13;
    puVar14[4] = local_38;
    uVar8 = archive_entry_nlink(entry);
    *(uint *)(puVar14 + 2) = uVar8 - 1;
    pcVar10 = archive_entry_pathname(entry);
    pcVar10 = strdup(pcVar10);
    puVar14[5] = pcVar10;
    if (pcVar10 != (char *)0x0) {
      return iVar4;
    }
  }
  pcVar10 = "Out of memory adding file to list";
LAB_00171784:
  archive_set_error(&a->archive,0xc,pcVar10);
  return -0x1e;
}

Assistant:

static int
archive_read_format_cpio_read_header(struct archive_read *a,
    struct archive_entry *entry)
{
	struct cpio *cpio;
	const void *h;
	struct archive_string_conv *sconv;
	size_t namelength;
	size_t name_pad;
	int r;

	cpio = (struct cpio *)(a->format->data);
	sconv = cpio->opt_sconv;
	if (sconv == NULL) {
		if (!cpio->init_default_conversion) {
			cpio->sconv_default =
			    archive_string_default_conversion_for_read(
			      &(a->archive));
			cpio->init_default_conversion = 1;
		}
		sconv = cpio->sconv_default;
	}
	
	r = (cpio->read_header(a, cpio, entry, &namelength, &name_pad));

	if (r < ARCHIVE_WARN)
		return (r);

	/* Read name from buffer. */
	h = __archive_read_ahead(a, namelength + name_pad, NULL);
	if (h == NULL)
	    return (ARCHIVE_FATAL);
	if (archive_entry_copy_pathname_l(entry,
	    (const char *)h, namelength, sconv) != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Pathname");
			return (ARCHIVE_FATAL);
		}
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Pathname can't be converted from %s to current locale.",
		    archive_string_conversion_charset_name(sconv));
		r = ARCHIVE_WARN;
	}
	cpio->entry_offset = 0;

	__archive_read_consume(a, namelength + name_pad);

	/* If this is a symlink, read the link contents. */
	if (archive_entry_filetype(entry) == AE_IFLNK) {
		h = __archive_read_ahead(a,
			(size_t)cpio->entry_bytes_remaining, NULL);
		if (h == NULL)
			return (ARCHIVE_FATAL);
		if (archive_entry_copy_symlink_l(entry, (const char *)h,
		    (size_t)cpio->entry_bytes_remaining, sconv) != 0) {
			if (errno == ENOMEM) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate memory for Linkname");
				return (ARCHIVE_FATAL);
			}
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Linkname can't be converted from %s to "
			    "current locale.",
			    archive_string_conversion_charset_name(sconv));
			r = ARCHIVE_WARN;
		}
		__archive_read_consume(a, cpio->entry_bytes_remaining);
		cpio->entry_bytes_remaining = 0;
	}

	/* XXX TODO: If the full mode is 0160200, then this is a Solaris
	 * ACL description for the following entry.  Read this body
	 * and parse it as a Solaris-style ACL, then read the next
	 * header.  XXX */

	/* Compare name to "TRAILER!!!" to test for end-of-archive. */
	if (namelength == 11 && strcmp((const char *)h, "TRAILER!!!") == 0) {
		/* TODO: Store file location of start of block. */
		archive_clear_error(&a->archive);
		return (ARCHIVE_EOF);
	}

	/* Detect and record hardlinks to previously-extracted entries. */
	if (record_hardlink(a, cpio, entry) != ARCHIVE_OK) {
		return (ARCHIVE_FATAL);
	}

	return (r);
}